

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_1in_8out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  
  for (lVar5 = 0; toMix != (uint32_t)lVar5; lVar5 = lVar5 + 1) {
    fVar2 = coefficients[1];
    fVar3 = coefficients[2];
    fVar4 = coefficients[3];
    fVar1 = src[lVar5];
    *dst = *dst + *coefficients * fVar1;
    dst[1] = dst[1] + fVar2 * fVar1;
    dst[2] = dst[2] + fVar3 * fVar1;
    dst[3] = dst[3] + fVar4 * fVar1;
    fVar2 = coefficients[5];
    fVar3 = coefficients[6];
    fVar4 = coefficients[7];
    dst[4] = coefficients[4] * fVar1 + dst[4];
    dst[5] = fVar2 * fVar1 + dst[5];
    dst[6] = fVar3 * fVar1 + dst[6];
    dst[7] = fVar4 * fVar1 + dst[7];
    dst = dst + 8;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_8out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 1, dst += 8)
	{
		dst[0] += src[0] * coefficients[0];
		dst[1] += src[0] * coefficients[1];
		dst[2] += src[0] * coefficients[2];
		dst[3] += src[0] * coefficients[3];
		dst[4] += src[0] * coefficients[4];
		dst[5] += src[0] * coefficients[5];
		dst[6] += src[0] * coefficients[6];
		dst[7] += src[0] * coefficients[7];
	}
}